

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>
::erase_empty_row(Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>
                  *this,Index rowIndex)

{
  ID_index rowID;
  Index rowIndex_local;
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>
  *this_local;
  
  return;
}

Assistant:

inline void Boundary_matrix<Master_matrix>::erase_empty_row(Index rowIndex)
{
  //computes real row index and erases it if necessary from the row swap map containers
  ID_index rowID = rowIndex;
  if constexpr (activeSwapOption) {
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      auto it = Swap_opt::indexToRow_.find(rowIndex);
      rowID = it->second;
      Swap_opt::rowToIndex_.erase(rowID);
      Swap_opt::indexToRow_.erase(it);
    } else {
      rowID = Swap_opt::indexToRow_[rowIndex];
    }
  }

  if constexpr (Master_matrix::Option_list::has_row_access && Master_matrix::Option_list::has_removable_rows) {
    RA_opt::erase_empty_row(rowID);
  }
}